

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O1

void shuff_interp_encode(bit_io_t *bio,uint64_t *A,uint64_t n)

{
  uint64_t *puVar1;
  int64_t *piVar2;
  stack *psVar3;
  long lVar4;
  undefined8 *puVar5;
  long extraout_RDX;
  undefined8 *__s;
  undefined8 *puVar6;
  long lVar7;
  size_t __size;
  long lVar8;
  stack *psVar9;
  long lVar10;
  long in_R8;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint64_t uVar16;
  ulong uVar17;
  ulong *puVar18;
  long lVar19;
  int64_t iVar20;
  long lVar21;
  
  *A = 0;
  A[n] = 0x8000000;
  uVar15 = 0x40 - LZCOUNT(n - 1);
  if (n - 1 == 0) {
    uVar15 = 0;
  }
  if (shuff_interp_encode::ss <= uVar15) {
    puVar6 = (undefined8 *)(uVar15 * 0x10 + 0x10);
    psVar3 = (stack *)realloc(shuff_interp_encode::s,(size_t)puVar6);
    if (psVar3 == (stack *)0x0) {
      psVar9 = shuff_interp_encode::s;
      shuff_interp_encode::s = psVar3;
      shuff_interp_encode();
      *puVar6 = 0;
      puVar6[extraout_RDX] = 0x8000000;
      lVar7 = LZCOUNT(extraout_RDX + -1);
      uVar15 = 0x40 - lVar7;
      if (extraout_RDX + -1 == 0) {
        uVar15 = 0;
      }
      if (shuff_interp_decode::ss <= uVar15) {
        __size = uVar15 * 0x10 + 0x10;
        psVar3 = (stack *)realloc(shuff_interp_decode::s,__size);
        if (psVar3 == (stack *)0x0) {
          psVar9 = shuff_interp_decode::s;
          shuff_interp_decode::s = psVar3;
          shuff_interp_decode();
          if (-1 < in_R8) {
            puVar6 = (undefined8 *)((long)__s + in_R8 * 8 + 1);
            puVar5 = __s + 1;
            if (__s + 1 < puVar6) {
              puVar5 = puVar6;
            }
            memset(__s,0,(~(ulong)__s + (long)puVar5 & 0xfffffffffffffff8) + 8);
          }
          if ((long)__size < 1) {
            lVar8 = 0;
          }
          else {
            piVar2 = &psVar9->lo;
            lVar8 = 0;
            do {
              uVar15 = (ulong)((int)psVar9->lo + 1);
              if (__s[uVar15] == 0) {
                *(ulong *)(lVar7 + lVar8 * 8) = uVar15;
                lVar8 = lVar8 + 1;
              }
              __s[uVar15] = __s[uVar15] + 1;
              psVar9 = (stack *)((long)&psVar9->lo + 4);
            } while (psVar9 < (stack *)((long)piVar2 + __size * 4));
          }
          *__s = 1;
          *(undefined8 *)(lVar7 + lVar8 * 8) = 0;
          return;
        }
        shuff_interp_decode::ss = uVar15 + 1;
        shuff_interp_decode::s = psVar3;
      }
      psVar3 = shuff_interp_decode::s;
      shuff_interp_decode::s->lo = 0;
      psVar3->hi = extraout_RDX;
      lVar7 = 1;
      do {
        lVar8 = psVar3[lVar7 + -1].lo;
        lVar10 = psVar3[lVar7 + -1].hi;
        lVar11 = puVar6[lVar10] - (puVar6[lVar8] + (lVar10 - lVar8));
        lVar4 = 1;
        if (lVar11 + 1 != 1) {
          lVar4 = 0x40 - LZCOUNT(lVar11);
          if (lVar11 == 0) {
            lVar4 = 0;
          }
          uVar15 = lVar4 - 1;
          if (uVar15 == 0) {
            uVar12 = 0;
          }
          else {
            uVar14 = psVar9[2].lo;
            if (uVar14 == 0x40) {
              uVar12 = *(ulong *)psVar9[1].hi;
            }
            else {
              uVar12 = *(long *)psVar9[1].hi << ((ulong)(byte)-(char)uVar14 & 0x3f);
            }
            uVar12 = uVar12 >> ((ulong)(byte)(0x41 - (char)lVar4) & 0x3f);
            iVar20 = uVar14 - uVar15;
            if (uVar14 < uVar15 || iVar20 == 0) {
              lVar21 = uVar15 - uVar14;
              puVar18 = (ulong *)(psVar9[1].hi + 8);
              psVar9[1].hi = (int64_t)puVar18;
              psVar9[2].lo = 0x40;
              if (0 < lVar21) {
                iVar20 = 0x40 - lVar21;
                uVar12 = uVar12 | *puVar18 >> (-lVar21 & 0x3fU);
                goto LAB_0012efbf;
              }
            }
            else {
LAB_0012efbf:
              psVar9[2].lo = iVar20;
            }
            if (psVar9[2].lo == 0) {
              psVar9[1].hi = psVar9[1].hi + 8;
              psVar9[2].lo = 0x40;
            }
          }
          lVar11 = (long)(1 << ((uint)lVar4 & 0x1f)) - (lVar11 + 1);
          if (lVar11 <= (long)uVar12) {
            puVar18 = (ulong *)psVar9[1].hi;
            uVar14 = psVar9[2].lo - 1;
            psVar9[2].lo = uVar14;
            uVar15 = *puVar18;
            if (uVar14 == 0) {
              psVar9[1].hi = (int64_t)(puVar18 + 1);
              psVar9[2].lo = 0x40;
            }
            uVar12 = (uVar12 * 2 - lVar11) + (ulong)((uVar15 >> (uVar14 & 0x3f) & 1) != 0);
          }
          lVar4 = uVar12 + 1;
        }
        lVar11 = lVar7 + -1;
        lVar13 = lVar10 - lVar8 >> 1;
        lVar21 = lVar13 + lVar8;
        puVar6[lVar21] = lVar4;
        lVar4 = lVar4 + -1 + puVar6[lVar8] + lVar13;
        puVar6[lVar21] = lVar4;
        if (puVar6[lVar10] - lVar4 == lVar10 - lVar21) {
          lVar7 = lVar21 + 1;
          if (lVar7 < lVar10) {
            lVar4 = puVar6[lVar21];
            do {
              lVar4 = lVar4 + 1;
              puVar6[lVar7] = lVar4;
              lVar7 = lVar7 + 1;
            } while (lVar7 < lVar10);
          }
        }
        else if (1 < lVar10 - lVar21) {
          psVar3[lVar11].lo = lVar21;
          psVar3[lVar11].hi = lVar10;
          lVar11 = lVar7;
        }
        lVar7 = lVar11;
        if (puVar6[lVar21] - puVar6[lVar8] == lVar13) {
          if (1 < lVar13) {
            lVar10 = puVar6[lVar8];
            lVar8 = lVar8 + 1;
            do {
              lVar10 = lVar10 + 1;
              puVar6[lVar8] = lVar10;
              lVar8 = lVar8 + 1;
            } while (lVar8 < lVar21);
          }
        }
        else if (1 < lVar13) {
          psVar3[lVar7].lo = lVar8;
          psVar3[lVar7].hi = lVar21;
          lVar7 = lVar7 + 1;
        }
        if (lVar7 == 0) {
          return;
        }
      } while( true );
    }
    shuff_interp_encode::ss = uVar15 + 1;
    shuff_interp_encode::s = psVar3;
  }
  psVar3 = shuff_interp_encode::s;
  shuff_interp_encode::s->lo = 0;
  psVar3->hi = n;
  lVar7 = 1;
  do {
    lVar10 = psVar3[lVar7 + -1].lo;
    lVar11 = psVar3[lVar7 + -1].hi;
    uVar12 = (A[lVar11] - (lVar11 - lVar10)) - A[lVar10];
    uVar15 = lVar11 - lVar10 >> 1;
    lVar8 = uVar15 + lVar10;
    lVar4 = 0x40 - LZCOUNT(uVar12);
    if (uVar12 == 0) {
      lVar4 = 0;
    }
    lVar13 = ~uVar12 + (long)(1 << ((uint)lVar4 & 0x1f));
    lVar19 = A[lVar8] - (A[lVar10] + uVar15);
    lVar21 = lVar13;
    if (lVar19 < lVar13) {
      lVar21 = 0;
    }
    uVar14 = lVar21 + lVar19;
    uVar12 = lVar4 - (ulong)(lVar19 < lVar13);
    if (uVar12 < bio->buff_btg) {
      *bio->out_u64 = *bio->out_u64 << (uVar12 & 0x3f) | uVar14;
      uVar16 = bio->buff_btg - uVar12;
    }
    else {
      puVar1 = bio->out_u64;
      uVar17 = *puVar1 << (bio->buff_btg & 0x3f);
      *puVar1 = uVar17;
      *puVar1 = uVar14 >> ((ulong)(uint)((int)uVar12 - (int)bio->buff_btg) & 0x3f) | uVar17;
      bio->out_u64 = puVar1 + 1;
      puVar1[1] = uVar14;
      uVar16 = (bio->buff_btg - uVar12) + 0x40;
    }
    lVar4 = lVar7 + -1;
    bio->buff_btg = uVar16;
    if ((1 < lVar11 - lVar8) && ((ulong)(lVar11 - lVar8) < A[lVar11] - A[lVar8])) {
      psVar3[lVar4].lo = lVar8;
      psVar3[lVar4].hi = lVar11;
      lVar4 = lVar7;
    }
    lVar7 = lVar4;
    if ((1 < (long)uVar15) && (uVar15 < A[lVar8] - A[lVar10])) {
      psVar3[lVar7].lo = lVar10;
      psVar3[lVar7].hi = lVar8;
      lVar7 = lVar7 + 1;
    }
  } while (lVar7 != 0);
  return;
}

Assistant:

void shuff_interp_encode(bit_io_t* bio, uint64_t* A, uint64_t n)
{
    int64_t lo, hi, mid, range;
    static stack* s = NULL;
    static uint64_t ss = 0;
    uint64_t stack_pointer = 0;

    A[0] = 0;
    A[n] = SHUFF_MAX_SYMBOL;

    SHUFF_CHECK_STACK_SIZE(SHUFF_ceil_log2(n) + 1);

    SHUFF_PUSH(0, n);
    while (SHUFF_STACK_NOT_EMPTY) {
        SHUFF_POP(lo, hi);
        range = A[hi] - A[lo] - (hi - lo - 1);
        mid = lo + ((hi - lo) >> 1);
        SHUFF_BINARY_ENCODE(bio, A[mid] - (A[lo] + (mid - lo - 1)), range);
        if ((hi - mid > 1) && (A[hi] - A[mid] > (uint64_t)(hi - mid)))
            SHUFF_PUSH(mid, hi);
        if ((mid - lo > 1) && (A[mid] - A[lo] > (uint64_t)(mid - lo)))
            SHUFF_PUSH(lo, mid);
    }
}